

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall
transaction_tests::basic_transaction_tests::test_method(basic_transaction_tests *this)

{
  Span<const_unsigned_char> sp;
  bool bVar1;
  long in_FS_OFFSET;
  CMutableTransaction tx;
  DataStream stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  TxValidationState state;
  uchar ch [260];
  CTransaction *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  DataStream *in_stack_fffffffffffffba8;
  undefined5 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc5;
  byte in_stack_fffffffffffffbc6;
  undefined1 in_stack_fffffffffffffbc7;
  size_t in_stack_fffffffffffffbc8;
  size_t line_num;
  CMutableTransaction *in_stack_fffffffffffffbd0;
  CMutableTransaction *tx_00;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbe0;
  undefined5 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbed;
  undefined1 in_stack_fffffffffffffbee;
  undefined1 in_stack_fffffffffffffbef;
  const_string local_3c8;
  lazy_ostream local_3b8 [2];
  assertion_result local_398 [2];
  assertion_result local_330 [2];
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_2f8;
  pointer in_stack_fffffffffffffd20;
  CTransaction *in_stack_fffffffffffffd28;
  undefined1 local_118 [272];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_118,&DAT_01ca09a0,0x104);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb98);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffffbe0,
             (uchar *)CONCAT17(in_stack_fffffffffffffbef,
                               CONCAT16(in_stack_fffffffffffffbee,
                                        CONCAT15(in_stack_fffffffffffffbed,in_stack_fffffffffffffbe8
                                                ))),
             (uchar *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
             (allocator_type *)in_stack_fffffffffffffbd0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb98);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffba8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  sp.m_data._5_1_ = in_stack_fffffffffffffbc5;
  sp.m_data._0_5_ = in_stack_fffffffffffffbc0;
  sp.m_data._6_1_ = in_stack_fffffffffffffbc6;
  sp.m_data._7_1_ = in_stack_fffffffffffffbc7;
  sp.m_size = in_stack_fffffffffffffbc8;
  DataStream::DataStream(in_stack_fffffffffffffba8,sp);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb98);
  local_2f8 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffffba8,
                         (CMutableTransaction *)
                         CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  DataStream::operator>>
            (in_stack_fffffffffffffba8,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffffb98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (const_string *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (const_string *)
               CONCAT17(in_stack_fffffffffffffbc7,
                        CONCAT16(in_stack_fffffffffffffbc6,
                                 CONCAT15(in_stack_fffffffffffffbc5,in_stack_fffffffffffffbc0))));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               in_stack_fffffffffffffbd0);
    bVar1 = CheckTransaction(in_stack_fffffffffffffd28,
                             (TxValidationState *)in_stack_fffffffffffffd20);
    if (bVar1) {
      ValidationState<TxValidationResult>::IsValid
                ((ValidationState<TxValidationResult> *)in_stack_fffffffffffffb98);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (char (*) [49])in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (unsigned_long)in_stack_fffffffffffffb98);
    in_stack_fffffffffffffb98 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_330,(lazy_ostream *)&stack0xfffffffffffffcb0,
               (const_string *)&stack0xfffffffffffffca0,0x1a2,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]>
                        *)in_stack_fffffffffffffb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb98);
    CTransaction::~CTransaction(in_stack_fffffffffffffb98);
    in_stack_fffffffffffffbdf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffbdf);
  tx_00 = (CMutableTransaction *)&stack0xfffffffffffffd18;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffba8,
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffba8,
             (value_type *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (const_string *)tx_00,line_num,
               (const_string *)
               CONCAT17(in_stack_fffffffffffffbc7,
                        CONCAT16(in_stack_fffffffffffffbc6,
                                 CONCAT15(in_stack_fffffffffffffbc5,in_stack_fffffffffffffbc0))));
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),tx_00);
    in_stack_fffffffffffffbc7 =
         CheckTransaction(in_stack_fffffffffffffd28,(TxValidationState *)in_stack_fffffffffffffd20);
    in_stack_fffffffffffffbc6 = 1;
    if ((bool)in_stack_fffffffffffffbc7) {
      in_stack_fffffffffffffbc5 =
           ValidationState<TxValidationResult>::IsValid
                     ((ValidationState<TxValidationResult> *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffbc6 = in_stack_fffffffffffffbc5 ^ 0xff;
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (char (*) [52])in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               (unsigned_long)in_stack_fffffffffffffb98);
    in_stack_fffffffffffffb98 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_398,local_3b8,&local_3c8,0x1a6,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>
                        *)in_stack_fffffffffffffb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb98);
    CTransaction::~CTransaction(in_stack_fffffffffffffb98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffffb98);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb98);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffb98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffba8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(basic_transaction_tests)
{
    // Random real transaction (e2769b09e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436)
    unsigned char ch[] = {0x01, 0x00, 0x00, 0x00, 0x01, 0x6b, 0xff, 0x7f, 0xcd, 0x4f, 0x85, 0x65, 0xef, 0x40, 0x6d, 0xd5, 0xd6, 0x3d, 0x4f, 0xf9, 0x4f, 0x31, 0x8f, 0xe8, 0x20, 0x27, 0xfd, 0x4d, 0xc4, 0x51, 0xb0, 0x44, 0x74, 0x01, 0x9f, 0x74, 0xb4, 0x00, 0x00, 0x00, 0x00, 0x8c, 0x49, 0x30, 0x46, 0x02, 0x21, 0x00, 0xda, 0x0d, 0xc6, 0xae, 0xce, 0xfe, 0x1e, 0x06, 0xef, 0xdf, 0x05, 0x77, 0x37, 0x57, 0xde, 0xb1, 0x68, 0x82, 0x09, 0x30, 0xe3, 0xb0, 0xd0, 0x3f, 0x46, 0xf5, 0xfc, 0xf1, 0x50, 0xbf, 0x99, 0x0c, 0x02, 0x21, 0x00, 0xd2, 0x5b, 0x5c, 0x87, 0x04, 0x00, 0x76, 0xe4, 0xf2, 0x53, 0xf8, 0x26, 0x2e, 0x76, 0x3e, 0x2d, 0xd5, 0x1e, 0x7f, 0xf0, 0xbe, 0x15, 0x77, 0x27, 0xc4, 0xbc, 0x42, 0x80, 0x7f, 0x17, 0xbd, 0x39, 0x01, 0x41, 0x04, 0xe6, 0xc2, 0x6e, 0xf6, 0x7d, 0xc6, 0x10, 0xd2, 0xcd, 0x19, 0x24, 0x84, 0x78, 0x9a, 0x6c, 0xf9, 0xae, 0xa9, 0x93, 0x0b, 0x94, 0x4b, 0x7e, 0x2d, 0xb5, 0x34, 0x2b, 0x9d, 0x9e, 0x5b, 0x9f, 0xf7, 0x9a, 0xff, 0x9a, 0x2e, 0xe1, 0x97, 0x8d, 0xd7, 0xfd, 0x01, 0xdf, 0xc5, 0x22, 0xee, 0x02, 0x28, 0x3d, 0x3b, 0x06, 0xa9, 0xd0, 0x3a, 0xcf, 0x80, 0x96, 0x96, 0x8d, 0x7d, 0xbb, 0x0f, 0x91, 0x78, 0xff, 0xff, 0xff, 0xff, 0x02, 0x8b, 0xa7, 0x94, 0x0e, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xba, 0xde, 0xec, 0xfd, 0xef, 0x05, 0x07, 0x24, 0x7f, 0xc8, 0xf7, 0x42, 0x41, 0xd7, 0x3b, 0xc0, 0x39, 0x97, 0x2d, 0x7b, 0x88, 0xac, 0x40, 0x94, 0xa8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xc1, 0x09, 0x32, 0x48, 0x3f, 0xec, 0x93, 0xed, 0x51, 0xf5, 0xfe, 0x95, 0xe7, 0x25, 0x59, 0xf2, 0xcc, 0x70, 0x43, 0xf9, 0x88, 0xac, 0x00, 0x00, 0x00, 0x00, 0x00};
    std::vector<unsigned char> vch(ch, ch + sizeof(ch) -1);
    DataStream stream(vch);
    CMutableTransaction tx;
    stream >> TX_WITH_WITNESS(tx);
    TxValidationState state;
    BOOST_CHECK_MESSAGE(CheckTransaction(CTransaction(tx), state) && state.IsValid(), "Simple deserialized transaction should be valid.");

    // Check that duplicate txins fail
    tx.vin.push_back(tx.vin[0]);
    BOOST_CHECK_MESSAGE(!CheckTransaction(CTransaction(tx), state) || !state.IsValid(), "Transaction with duplicate txins should be invalid.");
}